

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::getVertexShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest1_2 *this,_variable_type *variable_type,
          uint array_size)

{
  bool bVar1;
  _variable_type _Var2;
  ostream *poVar3;
  _variable_type *variable_type_00;
  _variable_type *variable_type_01;
  _variable_type *variable_type_02;
  uint array_index;
  ulong uVar4;
  int n_getter;
  int iVar5;
  bool *pbVar6;
  char *pcVar7;
  uint uVar8;
  uint array_index_1;
  uint uVar9;
  string variable_type_glsl_as_int;
  uint n_variable_type_components;
  string variable_type_glsl;
  _variable_type result_as_int_variable_type;
  _variable_type result_as_int_variable_type_1;
  stringstream variable_type_glsl_array_sstream;
  stringstream variable_type_glsl_arrayed_sstream;
  stringstream result_sstream;
  string local_548;
  ulong local_528;
  uint local_520;
  uint local_51c;
  string local_518;
  string *local_4f8;
  _variable_type local_4f0 [9];
  _variable_type local_4cc;
  stringstream local_4c8 [16];
  ostream local_4b8;
  stringstream local_340 [16];
  ostream local_330;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  local_4f8 = __return_storage_ptr__;
  _Var2 = Utils::getBaseVariableType(variable_type);
  local_520 = Utils::getNumberOfComponentsForVariableType(variable_type);
  local_51c = local_520;
  std::__cxx11::stringstream::stringstream(local_1b8);
  Utils::getVariableTypeGLSLString_abi_cxx11_(&local_518,(Utils *)variable_type,variable_type_00);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::operator<<(&local_330,(string *)&local_518);
  local_528 = (ulong)array_size;
  if (1 < array_size) {
    poVar3 = std::operator<<(&local_4b8,"[");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"]");
    std::__cxx11::stringbuf::str();
    std::operator<<(&local_330,(string *)&local_548);
    std::__cxx11::string::~string((string *)&local_548);
  }
  std::operator<<(&local_1a8,"#version 400\n\n#extension GL_ARB_shader_subroutine : require\n");
  if (*variable_type == VARIABLE_TYPE_DOUBLE) {
    std::operator<<(&local_1a8,"#extension GL_ARB_gpu_shader_fp64 : require\n");
  }
  poVar3 = std::operator<<(&local_1a8,"\nsubroutine ");
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,(string *)&local_548);
  poVar3 = std::operator<<(poVar3," colorGetter(in ");
  poVar3 = std::operator<<(poVar3,(string *)&local_518);
  poVar3 = std::operator<<(poVar3," in_value");
  std::__cxx11::stringbuf::str();
  poVar3 = std::operator<<(poVar3,(string *)local_4f0);
  std::operator<<(poVar3,");\n\n");
  std::__cxx11::string::~string((string *)local_4f0);
  std::__cxx11::string::~string((string *)&local_548);
  for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
    poVar3 = std::operator<<(&local_1a8,"subroutine(colorGetter) ");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_548);
    poVar3 = std::operator<<(poVar3," getter");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
    poVar3 = std::operator<<(poVar3,"(in ");
    poVar3 = std::operator<<(poVar3,(string *)&local_518);
    poVar3 = std::operator<<(poVar3," in_value");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)local_4f0);
    std::operator<<(poVar3,")\n{\n");
    std::__cxx11::string::~string((string *)local_4f0);
    std::__cxx11::string::~string((string *)&local_548);
    if (array_size < 2) {
      if (_Var2 == VARIABLE_TYPE_BOOL) {
        poVar3 = std::operator<<(&local_1a8,"    return ");
        pbVar6 = glcts::fixed_sample_locations_values + 1;
        if (iVar5 == 0) {
          bVar1 = std::operator==(&local_518,"bool");
          pbVar6 = (bool *)0x183cfff;
          if (bVar1) {
            pbVar6 = (bool *)0x178d1bb;
          }
        }
        poVar3 = std::operator<<(poVar3,pbVar6);
        pcVar7 = "(in_value);\n";
      }
      else {
        poVar3 = std::operator<<(&local_1a8,"    return (in_value + ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 1);
        pcVar7 = ");\n";
      }
    }
    else {
      poVar3 = std::operator<<(&local_1a8,(string *)&local_518);
      poVar3 = std::operator<<(poVar3," temp");
      std::__cxx11::stringbuf::str();
      poVar3 = std::operator<<(poVar3,(string *)&local_548);
      std::operator<<(poVar3,";\n");
      std::__cxx11::string::~string((string *)&local_548);
      if (_Var2 == VARIABLE_TYPE_BOOL) {
        for (uVar4 = 0; local_528 != uVar4; uVar4 = uVar4 + 1) {
          poVar3 = std::operator<<(&local_1a8,"    temp[");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,"] = ");
          pbVar6 = glcts::fixed_sample_locations_values + 1;
          if (iVar5 == 0) {
            bVar1 = std::operator==(&local_518,"bool");
            pbVar6 = (bool *)0x183cfff;
            if (bVar1) {
              pbVar6 = (bool *)0x178d1bb;
            }
          }
          poVar3 = std::operator<<(poVar3,pbVar6);
          poVar3 = std::operator<<(poVar3,"(in_value[");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::operator<<(poVar3,"]);\n");
        }
      }
      else {
        for (uVar4 = 0; local_528 != uVar4; uVar4 = uVar4 + 1) {
          poVar3 = std::operator<<(&local_1a8,"    temp[");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,"] = in_value[");
          poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          poVar3 = std::operator<<(poVar3,"] + ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5 + 1);
          std::operator<<(poVar3,";\n");
        }
      }
      pcVar7 = "    return temp;\n";
      poVar3 = &local_1a8;
    }
    std::operator<<(poVar3,pcVar7);
    std::operator<<(&local_1a8,"}\n");
  }
  std::operator<<(&local_1a8,"subroutine uniform colorGetter colorGetterUniform;\n\n");
  std::operator<<(&local_1a8,"out ");
  if (_Var2 == VARIABLE_TYPE_BOOL) {
    local_548._M_dataplus._M_p._0_4_ = 9;
    local_4f0[0] = Utils::getVariableTypeFromProperties((_variable_type *)&local_548,&local_520);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_548,(Utils *)local_4f0,variable_type_01);
    std::operator<<(&local_1a8,(string *)&local_548);
    std::__cxx11::string::~string((string *)&local_548);
  }
  else {
    std::operator<<(&local_1a8,(string *)&local_518);
  }
  std::operator<<(&local_1a8," result;\n\n");
  poVar3 = std::operator<<(&local_1a8,"void main()\n{\n    ");
  poVar3 = std::operator<<(poVar3,(string *)&local_518);
  std::operator<<(poVar3," temp");
  if (1 < array_size) {
    poVar3 = std::operator<<(&local_1a8,"[");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,"]");
  }
  std::operator<<(&local_1a8,";\n");
  for (uVar4 = 0; uVar4 != local_528; uVar4 = uVar4 + 1) {
    std::operator<<(&local_1a8,"    temp");
    if (1 < array_size) {
      poVar3 = std::operator<<(&local_1a8,"[");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"]");
    }
    poVar3 = std::operator<<(&local_1a8," = ");
    poVar3 = std::operator<<(poVar3,(string *)&local_518);
    std::operator<<(poVar3,"(");
    uVar8 = local_51c;
    if (_Var2 == VARIABLE_TYPE_BOOL) {
      std::operator<<(&local_1a8,"true");
    }
    else {
      while (uVar9 = uVar8 - 1, uVar8 != 0) {
        std::operator<<(&local_1a8,"3");
        bVar1 = uVar8 != 1;
        uVar8 = uVar9;
        if (bVar1) {
          std::operator<<(&local_1a8,", ");
        }
      }
    }
    std::operator<<(&local_1a8,");\n");
  }
  if (_Var2 == VARIABLE_TYPE_BOOL) {
    local_548._M_dataplus._M_p._0_4_ = 9;
    local_4cc = Utils::getVariableTypeFromProperties((_variable_type *)&local_548,&local_520);
    Utils::getVariableTypeGLSLString_abi_cxx11_(&local_548,(Utils *)&local_4cc,variable_type_02);
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(&local_1a8,(string *)local_4f0);
    std::operator<<(poVar3," subroutine_result = colorGetterUniform(temp);\nresult = ");
    std::__cxx11::string::~string((string *)local_4f0);
    for (uVar4 = 0; local_528 != uVar4; uVar4 = uVar4 + 1) {
      bVar1 = std::operator==(&local_518,"bool");
      pcVar7 = "all(subroutine_result";
      if (bVar1) {
        pcVar7 = "bool(subroutine_result";
      }
      std::operator<<(&local_1a8,pcVar7);
      if (1 < array_size) {
        poVar3 = std::operator<<(&local_1a8,"[");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,"]");
      }
      std::operator<<(&local_1a8,")");
      if (array_size - 1 != uVar4) {
        std::operator<<(&local_1a8,"&& ");
      }
    }
    poVar3 = std::operator<<(&local_1a8," == true ? ");
    poVar3 = std::operator<<(poVar3,(string *)&local_548);
    poVar3 = std::operator<<(poVar3,"(1) : ");
    poVar3 = std::operator<<(poVar3,(string *)&local_548);
    std::operator<<(poVar3,"(0);");
  }
  else {
    if (array_size < 2) {
      std::operator<<(&local_1a8,"result = colorGetterUniform(temp);\n");
      goto LAB_00a12b87;
    }
    poVar3 = std::operator<<(&local_1a8,(string *)&local_518);
    poVar3 = std::operator<<(poVar3," subroutine_result");
    std::__cxx11::stringbuf::str();
    poVar3 = std::operator<<(poVar3,(string *)&local_548);
    poVar3 = std::operator<<(poVar3,
                             " = colorGetterUniform(temp);\n\nif (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\nelse\nresult = "
                            );
    poVar3 = std::operator<<(poVar3,(string *)&local_518);
    std::operator<<(poVar3,"(-1);\n");
  }
  std::__cxx11::string::~string((string *)&local_548);
LAB_00a12b87:
  std::operator<<(&local_1a8,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return local_4f8;
}

Assistant:

std::string FunctionalTest1_2::getVertexShaderBody(const Utils::_variable_type& variable_type, unsigned int array_size)
{
	Utils::_variable_type base_variable_type		 = Utils::getBaseVariableType(variable_type);
	unsigned int		  n_variable_type_components = Utils::getNumberOfComponentsForVariableType(variable_type);
	std::stringstream	 result_sstream;
	std::string			  variable_type_glsl = Utils::getVariableTypeGLSLString(variable_type);
	std::stringstream	 variable_type_glsl_array_sstream;
	std::stringstream	 variable_type_glsl_arrayed_sstream;

	variable_type_glsl_arrayed_sstream << variable_type_glsl;

	if (array_size > 1)
	{
		variable_type_glsl_array_sstream << "[" << array_size << "]";
		variable_type_glsl_arrayed_sstream << variable_type_glsl_array_sstream.str();
	}

	/* Form pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n";

	if (variable_type == Utils::VARIABLE_TYPE_DOUBLE)
	{
		result_sstream << "#extension GL_ARB_gpu_shader_fp64 : require\n";
	}

	/* Form subroutine type declaration */
	result_sstream << "\n"
					  "subroutine "
				   << variable_type_glsl_arrayed_sstream.str() << " colorGetter(in " << variable_type_glsl
				   << " in_value" << variable_type_glsl_array_sstream.str() << ");\n"
																			   "\n";

	/* Declare getter functions */
	for (int n_getter = 0; n_getter < 2; ++n_getter)
	{
		result_sstream << "subroutine(colorGetter) " << variable_type_glsl_arrayed_sstream.str() << " getter"
					   << n_getter << "(in " << variable_type_glsl << " in_value"
					   << variable_type_glsl_array_sstream.str() << ")\n"
																	"{\n";

		if (array_size > 1)
		{
			result_sstream << variable_type_glsl << " temp" << variable_type_glsl_array_sstream.str() << ";\n";
		}

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = "
								   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
								   << "(in_value[" << array_index << "]);\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return "
							   << ((n_getter == 0) ? ((variable_type_glsl == "bool") ? "!" : "not") : "")
							   << "(in_value);\n";
			}
		} /* if (base_variable_type == Utils::VARIABLE_TYPE_BOOL) */
		else
		{
			if (array_size > 1)
			{
				for (unsigned int array_index = 0; array_index < array_size; ++array_index)
				{
					result_sstream << "    temp[" << array_index << "]"
																	" = in_value["
								   << array_index << "] + " << (n_getter + 1) << ";\n";
				}

				result_sstream << "    return temp;\n";
			}
			else
			{
				result_sstream << "    return (in_value + " << (n_getter + 1) << ");\n";
			}
		}

		result_sstream << "}\n";
	} /* for (both getter functions) */

	/* Declare subroutine uniform */
	result_sstream << "subroutine uniform colorGetter colorGetterUniform;\n"
					  "\n";

	/* Declare output variable */
	result_sstream << "out ";

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_as_int;
	}
	else
	{
		result_sstream << variable_type_glsl;
	}

	result_sstream << " result;\n"
					  "\n";

	/* Declare main(): prepare input argument for the subroutine function */
	result_sstream << "void main()\n"
					  "{\n"
					  "    "
				   << variable_type_glsl << " temp";

	if (array_size > 1)
	{
		result_sstream << "[" << array_size << "]";
	};

	result_sstream << ";\n";

	for (unsigned int array_index = 0; array_index < array_size; ++array_index)
	{
		result_sstream << "    temp";

		if (array_size > 1)
		{
			result_sstream << "[" << array_index << "]";
		}

		result_sstream << " = " << variable_type_glsl << "(";

		if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
		{
			result_sstream << "true";
		}
		else
		{
			for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
			{
				result_sstream << "3";

				if (n_component != (n_variable_type_components - 1))
				{
					result_sstream << ", ";
				}
			} /* for (all components) */
		}

		result_sstream << ");\n";
	} /* for (all array indices) */

	/* Declare main(): call the subroutine. Verify the input and write the result
	 *                 to the output variable.
	 **/
	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		Utils::_variable_type result_as_int_variable_type =
			Utils::getVariableTypeFromProperties(Utils::VARIABLE_TYPE_INT, n_variable_type_components);
		std::string variable_type_glsl_as_int = Utils::getVariableTypeGLSLString(result_as_int_variable_type);

		result_sstream << variable_type_glsl_arrayed_sstream.str() << " subroutine_result = colorGetterUniform(temp);\n"
																	  "result = ";

		for (unsigned int array_index = 0; array_index < array_size; ++array_index)
		{
			if (variable_type_glsl == "bool")
				result_sstream << "bool(subroutine_result";
			else
				result_sstream << "all(subroutine_result";

			if (array_size > 1)
			{
				result_sstream << "[" << array_index << "]";
			}

			result_sstream << ")";

			if (array_index != (array_size - 1))
			{
				result_sstream << "&& ";
			}
		}

		result_sstream << " == true ? " << variable_type_glsl_as_int << "(1) : " << variable_type_glsl_as_int << "(0);";
	}
	else
	{
		if (array_size > 1)
		{
			DE_ASSERT(array_size == 2);

			result_sstream << variable_type_glsl << " subroutine_result" << variable_type_glsl_array_sstream.str()
						   << " = colorGetterUniform(temp);\n"
							  "\n"
							  "if (subroutine_result[0] == subroutine_result[1]) result = subroutine_result[0];\n"
							  "else\n"
							  "result = "
						   << variable_type_glsl << "(-1);\n";
		}
		else
		{
			result_sstream << "result = colorGetterUniform(temp);\n";
		}
	}

	/* All done */
	result_sstream << "}\n";

	return result_sstream.str();
}